

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O1

int CoreWvsnprintf(CPalThread *pthrCurrent,LPWSTR Buffer,size_t Count,LPCWSTR Format,
                  __va_list_tag *aparg)

{
  LPCSTR lpMultiByteStr;
  bool bVar1;
  __va_list_tag *p_Var2;
  uint Type_00;
  BOOL BVar3;
  uint uVar4;
  errno_t eVar5;
  int iVar6;
  DWORD DVar7;
  int cchWideChar;
  short *psVar8;
  CPalThread *pCVar9;
  int *piVar10;
  size_t sVar11;
  undefined2 *puVar12;
  uint *puVar13;
  ulong uVar14;
  undefined8 *puVar15;
  ulong uVar16;
  CPalThread *szSize;
  uint uVar17;
  CPalThread *pCVar18;
  long in_FS_OFFSET;
  bool bVar19;
  _func_int **pp_Stack_4c8;
  va_list apcopy;
  uint local_4a4;
  LPWSTR pWStack_4a0;
  INT Prefix;
  LPCWSTR local_498;
  LPCWSTR Fmt;
  WCHAR TempWChar [2];
  uint local_480;
  uint local_47c;
  INT Flags;
  INT Type;
  undefined1 local_470 [8];
  LPWSTR BufferPtr;
  INT Width;
  INT Precision;
  undefined1 auStack_458 [8];
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pWStack_4a0 = Buffer;
  local_498 = Format;
  local_470 = (undefined1  [8])Buffer;
  if (!PAL_InitializeChakraCoreCalled) {
LAB_003195a0:
    abort();
  }
  ap[0].overflow_arg_area = aparg->reg_save_area;
  auStack_458 = *(undefined1 (*) [8])aparg;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  apcopy[0].reg_save_area = (void *)(long)(int)Count;
  Fmt._4_4_ = 0;
  _TempWChar = (CPalThread *)0x0;
  uVar17 = 0;
  local_498 = Format;
  _Flags = Count;
LAB_003189e3:
  do {
    iVar6 = (int)Count;
    _Width = (CPalThread *)Buffer;
    if ((*local_498 == L'\0') || (bVar19 = uVar17 != 0, uVar17 = 1, bVar19)) {
LAB_00319532:
      if ((long)Buffer - (long)pWStack_4a0 >> 1 < (long)iVar6) {
        *(undefined2 *)&((__va_list_tag *)&((CPalThread *)Buffer)->_vptr_CPalThread)->gp_offset = 0;
      }
      local_470 = (undefined1  [8])Buffer;
      if (uVar17 == 0) {
        iVar6 = (int)((ulong)((long)Buffer - (long)pWStack_4a0) >> 1);
        goto LAB_0031957f;
      }
      piVar10 = __errno_location();
      *piVar10 = 0x22;
      goto LAB_0031957a;
    }
    uVar16 = (long)Buffer - (long)pWStack_4a0;
    if ((long)apcopy[0].reg_save_area <= (long)uVar16 >> 1) goto LAB_00319532;
    if ((*local_498 == L'%') &&
       (BVar3 = Internal_ExtractFormatW
                          (pthrCurrent,&local_498,local_438,(LPINT)&local_480,(LPINT)&BufferPtr,
                           (LPINT)((long)&BufferPtr + 4),(LPINT)&local_4a4,(LPINT)&local_47c),
       Buffer = (LPWSTR)_Width, Type_00 = local_47c, uVar17 = local_4a4, BVar3 != 0)) {
      if (((((local_4a4 == 4) || (local_4a4 == 2)) && ((local_47c & 0xfffffffe) == 2)) ||
          (uVar4 = local_4a4 ^ 1, local_47c == 2 && uVar4 == 0)) ||
         ((local_47c == 3 && ((local_480 & 4) != 0)))) {
        local_470 = (undefined1  [8])_Width;
        if ((int)BufferPtr == -3) {
          if ((uint)auStack_458._0_4_ < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        else if ((int)BufferPtr == -2) {
          uVar16 = (ulong)auStack_458 & 0xffffffff;
          if (uVar16 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            piVar10 = (int *)(uVar16 + (long)ap[0].overflow_arg_area);
          }
          else {
            piVar10 = (int *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          BufferPtr._0_4_ = *piVar10;
        }
        if (BufferPtr._4_4_ == 0xfffffffc) {
          if ((uint)auStack_458._0_4_ < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        else if (BufferPtr._4_4_ == 0xfffffffe) {
          uVar16 = (ulong)auStack_458 & 0xffffffff;
          if (uVar16 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            puVar13 = (uint *)(uVar16 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar13 = (uint *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          BufferPtr._4_4_ = *puVar13;
          Fmt._4_4_ = 1;
        }
        uVar16 = (ulong)auStack_458 & 0xffffffff;
        if ((local_4a4 == 4) || (local_4a4 == 2 && local_47c == 2)) {
          if ((uint)auStack_458._0_4_ < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            puVar15 = (undefined8 *)(uVar16 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar15 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          _TempWChar = (CPalThread *)*puVar15;
          pCVar9 = (CPalThread *)0x0;
LAB_00319202:
          pCVar18 = _TempWChar;
          if (Fmt._4_4_ == 0) {
            sVar11 = PAL_wcslen((char16_t *)_TempWChar);
            uVar17 = (uint)sVar11;
          }
          else if ((int)BufferPtr._4_4_ < 0) {
            uVar17 = 0;
          }
          else {
            uVar17 = 0;
            do {
              if (*(short *)((long)&_TempWChar->_vptr_CPalThread + (long)(int)uVar17 * 2) == 0)
              break;
              uVar17 = uVar17 + 1;
            } while ((int)uVar17 <= (int)BufferPtr._4_4_);
          }
          szSize = (CPalThread *)((long)(int)(uVar17 + 1) * 2);
          _Width = pCVar9;
          pthrCurrent = (CPalThread *)CorUnix::InternalMalloc((size_t)szSize);
          if (pthrCurrent == (CPalThread *)0x0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_003195a0;
            piVar10 = __errno_location();
            *piVar10 = 8;
            pthrCurrent = szSize;
            if (Width != 0) {
              CorUnix::InternalFree(pCVar18);
              pthrCurrent = pCVar18;
            }
            bVar1 = false;
            uVar17 = 0;
          }
          else {
            if ((ulong)BufferPtr._4_4_ == 0xfffffffd) {
              *(undefined2 *)&pthrCurrent->_vptr_CPalThread = 0;
              uVar17 = 0;
            }
            else if (((int)BufferPtr._4_4_ < 1) || ((int)uVar17 <= (int)BufferPtr._4_4_)) {
              PAL_wcscpy((char16_t *)pthrCurrent,(char16_t *)pCVar18);
            }
            else {
              eVar5 = wcsncpy_s((char16_t_conflict *)pthrCurrent,(long)(int)(uVar17 + 1),
                                (char16_t_conflict *)pCVar18,(ulong)BufferPtr._4_4_);
              uVar17 = BufferPtr._4_4_;
              if (eVar5 != 0) {
                if (PAL_InitializeChakraCoreCalled != false) {
                  if (Width != 0) {
                    CorUnix::InternalFree(pCVar18);
                  }
                  CorUnix::InternalFree(pthrCurrent);
                  if (PAL_InitializeChakraCoreCalled != false) {
                    bVar1 = false;
                    uVar17 = 0;
                    goto LAB_00319525;
                  }
                }
                goto LAB_003195a0;
              }
            }
            uVar17 = Internal_AddPaddingW
                               ((LPWSTR *)local_470,
                                iVar6 - (int)((ulong)((long)local_470 - (long)pWStack_4a0) >> 1),
                                (LPWSTR)pthrCurrent,(int)BufferPtr - uVar17,local_480);
            if (Width != 0) {
              CorUnix::InternalFree(_TempWChar);
            }
            uVar17 = uVar17 ^ 1;
            CorUnix::InternalFree(pthrCurrent);
            bVar1 = true;
          }
        }
        else {
          if ((uint)auStack_458._0_4_ < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            puVar15 = (undefined8 *)(uVar16 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar15 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpMultiByteStr = (LPCSTR)*puVar15;
          cchWideChar = MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)0x0,0);
          if (cchWideChar == 0) {
            pCVar9 = (CPalThread *)0x0;
            fprintf((FILE *)_stderr,"] %s %s:%d","CoreWvsnprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x7ae);
            pthrCurrent = _stderr;
            fprintf((FILE *)_stderr,"Unable to convert from multibyte  to wide char.\n");
            bVar19 = false;
          }
          else {
            pthrCurrent = (CPalThread *)((ulong)(cchWideChar + 1) * 2);
            pCVar9 = (CPalThread *)CorUnix::InternalMalloc((size_t)pthrCurrent);
            if (pCVar9 == (CPalThread *)0x0) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_003195a0;
              pCVar9 = (CPalThread *)0x0;
              bVar19 = false;
              _TempWChar = (CPalThread *)0x0;
            }
            else {
              pthrCurrent = (CPalThread *)0x0;
              _TempWChar = pCVar9;
              MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)pCVar9,cchWideChar);
              bVar19 = true;
              pCVar9 = (CPalThread *)&DAT_00000001;
            }
          }
          bVar1 = false;
          uVar17 = 0;
          if (bVar19) goto LAB_00319202;
        }
LAB_00319525:
        Buffer = (LPWSTR)local_470;
        if (!bVar1) {
LAB_0031957a:
          iVar6 = -1;
LAB_0031957f:
          if (*(long *)(in_FS_OFFSET + 0x28) != TempBuff._1016_8_) {
            __stack_chk_fail();
          }
          return iVar6;
        }
      }
      else if (local_47c == 1 && local_4a4 == 2) {
        local_470 = (undefined1  [8])_Width;
        if ((int)BufferPtr + 3U < 2) {
          if ((uint)auStack_458._0_4_ < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((BufferPtr._4_4_ & 0xfffffffd) == 0xfffffffc) {
          if ((uint)auStack_458._0_4_ < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        uVar14 = (ulong)auStack_458 & 0xffffffff;
        if (uVar14 < 0x29) {
          auStack_458._0_4_ = auStack_458._0_4_ + 8;
          puVar12 = (undefined2 *)(uVar14 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar12 = (undefined2 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Fmt._0_2_ = *puVar12;
        Fmt._2_2_ = 0;
        pthrCurrent = (CPalThread *)local_470;
        uVar17 = Internal_AddPaddingW
                           ((LPWSTR *)pthrCurrent,iVar6 - (int)(uVar16 >> 1),(LPWSTR)&Fmt,
                            (int)BufferPtr + -1,local_480);
        uVar17 = uVar17 ^ 1;
        Buffer = (LPWSTR)local_470;
      }
      else if (local_47c == 6) {
        local_470 = (undefined1  [8])_Width;
        if ((int)BufferPtr == -2) {
          uVar14 = (ulong)auStack_458 & 0xffffffff;
          if (uVar14 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            piVar10 = (int *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            piVar10 = (int *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          BufferPtr._0_4_ = *piVar10;
        }
        if (BufferPtr._4_4_ == 0xfffffffe) {
          uVar14 = (ulong)auStack_458 & 0xffffffff;
          if (uVar14 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            puVar13 = (uint *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar13 = (uint *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          BufferPtr._4_4_ = *puVar13;
        }
        uVar14 = (ulong)auStack_458 & 0xffffffff;
        if (local_4a4 == 1) {
          if ((uint)auStack_458._0_4_ < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            puVar15 = (undefined8 *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar15 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*puVar15 = (short)(uVar16 >> 1);
          uVar17 = 0;
        }
        else {
          if ((uint)auStack_458._0_4_ < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            puVar15 = (undefined8 *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar15 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*puVar15 = (int)(uVar16 >> 1);
          uVar17 = 0;
        }
      }
      else {
        uVar16 = Count - ((long)uVar16 >> 1);
        if (0x3fffffff < uVar16) {
          uVar16 = 0x40000000;
        }
        pCVar9 = _Width;
        if (local_47c == 5 && uVar4 == 0) {
          uVar14 = (ulong)auStack_458 & 0xffffffff;
          if (uVar14 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            psVar8 = (short *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            psVar8 = (short *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar4 = snprintf((char *)_Width,uVar16,local_438,(long)*psVar8);
        }
        else if (uVar4 == 0 && local_47c == 4) {
          uVar14 = (ulong)auStack_458 & 0xffffffff;
          if (uVar14 < 0x29) {
            auStack_458._0_4_ = auStack_458._0_4_ + 8;
            psVar8 = (short *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            psVar8 = (short *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar4 = snprintf((char *)_Width,uVar16,local_438,(ulong)(uint)(int)*psVar8);
        }
        else {
          apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
          pp_Stack_4c8 = (_func_int **)auStack_458;
          apcopy[0].gp_offset = ap[0].gp_offset;
          apcopy[0].fp_offset = ap[0].fp_offset;
          uVar4 = vsnprintf((char *)_Width,uVar16,local_438,&pp_Stack_4c8);
          pCVar9 = (CPalThread *)auStack_458;
          PAL_printf_arg_remover((va_list *)pCVar9,(int)BufferPtr,BufferPtr._4_4_,Type_00,uVar17);
        }
        uVar17 = 0;
        if (uVar4 == 0) {
          iVar6 = 2;
LAB_00318d51:
          uVar17 = 0;
          pthrCurrent = pCVar9;
          Count = _Flags;
        }
        else if (((int)uVar4 < 0) || (uVar14 = (ulong)uVar4, uVar16 <= uVar14)) {
          pCVar18 = (CPalThread *)(uVar16 + 1);
          pthrCurrent = pCVar18;
          pCVar9 = (CPalThread *)CorUnix::InternalMalloc((size_t)pCVar18);
          Buffer = (LPWSTR)_Width;
          Count = _Flags;
          if (pCVar9 != (CPalThread *)0x0) {
            eVar5 = strncpy_s((char *)pCVar9,(size_t)pCVar18,(char *)_Width,uVar16);
            if (eVar5 == 0) {
              iVar6 = MultiByteToWideChar(0,0,(LPCSTR)pCVar9,(int)uVar16,Buffer,(int)uVar16);
              uVar17 = 1;
              pthrCurrent = pCVar9;
              if (iVar6 != 0) goto LAB_00318e16;
              fprintf((FILE *)_stderr,"] %s %s:%d","CoreWvsnprintf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                      ,0x87d);
              pCVar18 = _stderr;
              DVar7 = GetLastError();
              fprintf((FILE *)pCVar18,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar7);
            }
            else {
              fprintf((FILE *)_stderr,"] %s %s:%d","CoreWvsnprintf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                      ,0x870);
              fprintf((FILE *)_stderr,"strncpy_s failed!\n");
            }
            CorUnix::InternalFree(pCVar9);
            iVar6 = 1;
            goto LAB_00318d51;
          }
          if (PAL_InitializeChakraCoreCalled == false) {
            local_470 = (undefined1  [8])_Width;
            abort();
          }
          piVar10 = __errno_location();
          *piVar10 = 0xc;
          iVar6 = 1;
        }
        else {
          pCVar18 = (CPalThread *)(long)(int)(uVar4 + 1);
          pthrCurrent = pCVar18;
          pCVar9 = (CPalThread *)CorUnix::InternalMalloc((size_t)pCVar18);
          Buffer = (LPWSTR)_Width;
          Count = _Flags;
          if (pCVar9 == (CPalThread *)0x0) {
            if (PAL_InitializeChakraCoreCalled == false) {
              local_470 = (undefined1  [8])_Width;
              abort();
            }
            piVar10 = __errno_location();
            *piVar10 = 8;
          }
          else {
            eVar5 = strncpy_s((char *)pCVar9,(size_t)pCVar18,(char *)_Width,uVar14);
            if (eVar5 != 0) {
              fprintf((FILE *)_stderr,"] %s %s:%d","CoreWvsnprintf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                      ,0x892);
              fprintf((FILE *)_stderr,"strncpy_s failed!\n");
              CorUnix::InternalFree(pCVar9);
              iVar6 = 1;
              goto LAB_00318d51;
            }
            uVar17 = 0;
            iVar6 = MultiByteToWideChar(0,0,(LPCSTR)pCVar9,uVar4,Buffer,uVar4);
            Count = _Flags;
            pthrCurrent = pCVar9;
            uVar16 = uVar14;
            if (iVar6 != 0) {
LAB_00318e16:
              Count = _Flags;
              p_Var2 = (__va_list_tag *)&_Width->_vptr_CPalThread;
              CorUnix::InternalFree(pthrCurrent);
              iVar6 = 0;
              Buffer = (LPWSTR)((long)&p_Var2->gp_offset + uVar16 * 2);
              goto LAB_00318d58;
            }
            fprintf((FILE *)_stderr,"] %s %s:%d","CoreWvsnprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x89f);
            pCVar18 = _stderr;
            DVar7 = GetLastError();
            fprintf((FILE *)pCVar18,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar7);
            CorUnix::InternalFree(pCVar9);
            pthrCurrent = pCVar9;
          }
          uVar17 = 0;
          iVar6 = 1;
          Buffer = (LPWSTR)_Width;
        }
LAB_00318d58:
        if ((iVar6 != 2) && (local_470 = (undefined1  [8])Buffer, iVar6 != 0)) goto LAB_0031957a;
      }
      goto LAB_003189e3;
    }
    Buffer = (LPWSTR)((long)&((__va_list_tag *)&_Width->_vptr_CPalThread)->gp_offset + 2);
    *(WCHAR *)&((__va_list_tag *)&_Width->_vptr_CPalThread)->gp_offset = *local_498;
    uVar17 = 0;
    local_498 = local_498 + 1;
    local_470 = (undefined1  [8])Buffer;
  } while( true );
}

Assistant:

int CoreWvsnprintf(CPalThread *pthrCurrent, LPWSTR Buffer, size_t Count, LPCWSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPWSTR BufferPtr = Buffer;
    LPCWSTR Fmt = Format;
    LPWSTR TempWStr = NULL;
    LPWSTR WorkingWStr = NULL;
    WCHAR TempWChar[2];
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT TempInt;
    LPSTR TempNumberBuffer;
    int mbtowcResult;
    va_list(ap);

    PERF_ENTRY(wvsnprintf);
    ENTRY("wvsnprintf (buffer=%p, count=%u, format=%p (%S))\n",
          Buffer, Count, Format, Format);

    va_copy(ap, aparg);
    BOOL precisionSet = false;

    while (*Fmt)
    {
        if (BufferRanOut || (BufferPtr - Buffer) >= static_cast<int>(Count)) //Count is assumed to be in the range of int
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatW(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (((Prefix == PFF_PREFIX_LONG || Prefix == PFF_PREFIX_LONG_W) &&
                (Type == PFF_TYPE_STRING || Type == PFF_TYPE_WSTRING)) ||
                (Prefix == PFF_PREFIX_SHORT && Type == PFF_TYPE_STRING) ||
                (Type == PFF_TYPE_WSTRING && (Flags & PFF_ZERO) != 0))
            {
                BOOL needToFree = FALSE;

                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                    precisionSet = true;
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if ((Type == PFF_TYPE_STRING && Prefix == PFF_PREFIX_LONG) ||
                    Prefix == PFF_PREFIX_LONG_W)
                {
                    TempWStr = va_arg(ap, LPWSTR);
                }
                else
                {
                    // %lS and %hs assume an LPSTR argument.
                    LPSTR s = va_arg(ap, LPSTR );
                    UINT Length = 0;
                    Length = MultiByteToWideChar( CP_ACP, 0, s, -1, NULL, 0 );
                    if ( Length != 0 )
                    {
                        TempWStr =
                            (LPWSTR)InternalMalloc((Length + 1 ) * sizeof( WCHAR ) );
                        if ( TempWStr )
                        {
                            needToFree = TRUE;
                            MultiByteToWideChar( CP_ACP, 0, s, -1,
                                                 TempWStr, Length );
                        }
                        else
                        {
                            ERROR( "InternalMalloc failed.\n" );
                            va_end(ap);
                            return -1;
                        }
                    }
                    else
                    {
                        ASSERT( "Unable to convert from multibyte "
                               " to wide char.\n" );
                        va_end(ap);
                        return -1;
                    }
                }

                INT Length = 0;
                if (precisionSet)
                {
                    for(; Length <= Precision && TempWStr[Length] != 0; Length++);
                }
                else
                {
                    Length = PAL_wcslen(TempWStr);
                }

                WorkingWStr = (LPWSTR) InternalMalloc(sizeof(WCHAR) * (Length + 1));
                if (!WorkingWStr)
                {
                    ERROR("InternalMalloc failed\n");
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if (needToFree)
                    {
                        InternalFree(TempWStr);
                    }
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    // Copy nothing
                    *WorkingWStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length)
                {
                    if (wcsncpy_s(WorkingWStr, (Length + 1), TempWStr, Precision) != SAFECRT_SUCCESS)
                    {
                        ERROR("CoreWvsnprintf failed\n");
                        if (needToFree)
                        {
                            InternalFree(TempWStr);
                        }
                        InternalFree(WorkingWStr);
                        LOGEXIT("wcsncpy_s failed!\n");
                        PERF_EXIT(wvsnprintf);
                        va_end(ap);
                        return (-1);
                    }
                    Length = Precision;
                }
                else
                {
                    // Copy everything
                    PAL_wcscpy(WorkingWStr, TempWStr);
                }

                // Add padding if needed.
                BufferRanOut = !Internal_AddPaddingW(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   WorkingWStr,
                                                   Width - Length,
                                                   Flags);

                if (needToFree)
                {
                    InternalFree(TempWStr);
                }
                InternalFree(WorkingWStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar[0] = va_arg(ap, int);
                TempWChar[1] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingW(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempWChar,
                                                   Width - 1,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else
            {
                // Types that sprintf can handle

                /* note: I'm using the wide buffer as a (char *) buffer when I
                   pass it to sprintf().  After I get the buffer back I make a
                   backup of the chars copied and then convert them to wide
                   and place them in the buffer (BufferPtr) */
                size_t TempCount = Count - (BufferPtr - Buffer);
                TempInt = 0;

#if !HAVE_LARGE_SNPRINTF_SUPPORT
                // Limit TempCount to 0x40000000, which is sufficient
                // for platforms on which snprintf fails for very large
                // sizes.
                if (TempCount > 0x40000000)
                {
                    TempCount = 0x40000000;
                }
#endif  // HAVE_LARGE_SNPRINTF_SUPPORT

                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf((LPSTR)BufferPtr, TempCount, TempBuff, trunc1);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf((LPSTR)BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = vsnprintf((LPSTR) BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt == 0)
                {
                    // The argument is "".
                    continue;
                }
                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    TempNumberBuffer = (LPSTR) InternalMalloc(TempCount+1);
                    if (!TempNumberBuffer)
                    {
                        ERROR("InternalMalloc failed\n");
                        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                        errno = ENOMEM;
                        va_end(ap);
                        return -1;
                    }

                    if (strncpy_s(TempNumberBuffer, TempCount+1, (LPSTR) BufferPtr, TempCount) != SAFECRT_SUCCESS)
                    {
                        ASSERT("strncpy_s failed!\n");
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }

                    mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                       TempNumberBuffer,
                                                       TempCount,
                                                       BufferPtr, TempCount);
                    if (!mbtowcResult)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    TempNumberBuffer = (LPSTR) InternalMalloc(TempInt+1);
                    if (!TempNumberBuffer)
                    {
                        ERROR("InternalMalloc failed\n");
                        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                        va_end(ap);
                        return -1;
                    }

                    if (strncpy_s(TempNumberBuffer, TempInt+1, (LPSTR) BufferPtr, TempInt) != SAFECRT_SUCCESS)
                    {
                        ASSERT("strncpy_s failed!\n");
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }

                    mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                       TempNumberBuffer,
                                                       TempInt,
                                                       BufferPtr, TempInt);
                    if (!mbtowcResult)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                              GetLastError());
                        InternalFree(TempNumberBuffer);
                        va_end(ap);
                        return -1;
                    }
                    BufferPtr += TempInt;
                }
                InternalFree(TempNumberBuffer);
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (static_cast<int>(Count) > (BufferPtr - Buffer)) //Count is assumed to be in the range of int
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        errno = ERANGE;
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}